

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9SatClp(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint nCubeLim;
  uint uVar3;
  Vec_Str_t *p;
  char *pcVar4;
  char *pcVar5;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_40 = 0;
  Extra_UtilGetoptReset();
  nCubeLim = 1000;
  local_44 = 1000000;
  local_3c = 0;
LAB_0025b76b:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"CLcvh");
    iVar1 = globalUtilOptind;
    if (iVar2 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0025b83f:
        Abc_Print(-1,pcVar4);
        goto LAB_0025b849;
      }
      nCubeLim = atoi(argv[globalUtilOptind]);
      uVar3 = nCubeLim;
    }
    else {
      if (iVar2 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          p = Bmc_CollapseOne(pAbc->pGia,nCubeLim,local_44,local_40,0,local_3c);
          Vec_StrFree(p);
          return 0;
        }
        Abc_Print(-1,"Abc_CommandAbc9SatClp(): There is no AIG.\n");
        return 0;
      }
      if (iVar2 != 0x4c) {
        if (iVar2 == 99) {
          local_40 = local_40 ^ 1;
        }
        else {
          if (iVar2 != 0x76) goto LAB_0025b849;
          local_3c = local_3c ^ 1;
        }
        goto LAB_0025b76b;
      }
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_0025b83f;
      }
      local_44 = atoi(argv[globalUtilOptind]);
      uVar3 = local_44;
    }
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
LAB_0025b849:
      Abc_Print(-2,"usage: &satclp [-CL num] [-cvh]\n");
      Abc_Print(-2,"\t         performs SAT based collapsing\n");
      Abc_Print(-2,"\t-C num : the limit on the SOP size of one output [default = %d]\n",
                (ulong)nCubeLim);
      Abc_Print(-2,
                "\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n",
                (ulong)local_44);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (local_40 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggles using canonical ISOP computation [default = %s]\n",pcVar4);
      if (local_3c == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9SatClp( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Str_t * Bmc_CollapseOne( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    int nCubeLim = 1000;
    int nBTLimit = 1000000;
    int fCanon   = 0;
    int fVerbose = 0;
    int c;

    Vec_Str_t * vSop;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CLcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubeLim < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'c':
            fCanon ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9SatClp(): There is no AIG.\n" );
        return 0;
    }
    vSop = Bmc_CollapseOne( pAbc->pGia, nCubeLim, nBTLimit, fCanon, 0, fVerbose );
    Vec_StrFree( vSop );
    return 0;

usage:
    Abc_Print( -2, "usage: &satclp [-CL num] [-cvh]\n" );
    Abc_Print( -2, "\t         performs SAT based collapsing\n" );
    Abc_Print( -2, "\t-C num : the limit on the SOP size of one output [default = %d]\n", nCubeLim );
    Abc_Print( -2, "\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-c     : toggles using canonical ISOP computation [default = %s]\n", fCanon? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}